

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Launcher.cpp
# Opt level: O0

void __thiscall Launcher::~Launcher(Launcher *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x50));
  std::shared_ptr<Engine>::~shared_ptr((shared_ptr<Engine> *)0x18b01a);
  std::shared_ptr<DTree>::~shared_ptr((shared_ptr<DTree> *)0x18b028);
  std::shared_ptr<MachineLearningModel>::~shared_ptr((shared_ptr<MachineLearningModel> *)0x18b036);
  std::shared_ptr<DataHandler>::~shared_ptr((shared_ptr<DataHandler> *)0x18b044);
  std::enable_shared_from_this<Launcher>::~enable_shared_from_this
            ((enable_shared_from_this<Launcher> *)0x18b04e);
  return;
}

Assistant:

Launcher::~Launcher()
{
}